

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void start_children(char *prefix,int argc,char **argv)

{
  pid_t __pid;
  pid_t __pid_00;
  char *__ptr;
  undefined8 in_RDI;
  pid_t c2_id;
  pid_t c1_id;
  char *build_path;
  char client_name [100];
  char server_name [100];
  char local_f8 [40];
  char **in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  char local_88 [128];
  undefined8 local_8;
  
  local_8 = in_RDI;
  __ptr = find_build_path();
  sprintf(local_88,"%s/%s/%s-%s",__ptr,local_8,local_8,"server");
  sprintf(local_f8,"%s/%s/%s-%s",__ptr,local_8,local_8,"client");
  __pid = start_child(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30)
  ;
  __pid_00 = start_child(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                         in_stack_ffffffffffffff30);
  waitpid(__pid,(int *)0x0,2);
  waitpid(__pid_00,(int *)0x0,2);
  free(__ptr);
  return;
}

Assistant:

void start_children(char *prefix, int argc, char *argv[]) {
	char server_name[100];
	char client_name[100];

	char *build_path = find_build_path();

	// clang-format off
	sprintf(
		server_name,
		"%s/%s/%s-%s",
		build_path,
		prefix,
		prefix,
		"server"
	);

	sprintf(
		client_name,
		"%s/%s/%s-%s",
		build_path,
		prefix,
		prefix,
		"client"
	);
	// clang-format on

	pid_t c1_id = start_child(server_name, argc, argv);
	pid_t c2_id = start_child(client_name, argc, argv);

	waitpid(c1_id, NULL, WUNTRACED);
	waitpid(c2_id, NULL, WUNTRACED);

	free(build_path);
}